

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void __thiscall SchemaAdapter::SchemaAdapter(SchemaAdapter *this,PrefsPtr *prefs,SchemaPtr *schema)

{
  anon_class_8_1_8991fb9c local_28;
  
  cursespp::ScrollAdapterBase::ScrollAdapterBase(&this->super_ScrollAdapterBase);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)&PTR__SchemaAdapter_001c0af0;
  *(undefined8 *)&(this->onChanged).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onChanged).super__Function_base._M_functor + 8) = 0;
  (this->onChanged).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onChanged)._M_invoker = (_Invoker_type)0x0;
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->schema).super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>,
             &schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>);
  this->changed = false;
  local_28.this = this;
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)&this->onChanged,&local_28);
  return;
}

Assistant:

SchemaAdapter(PrefsPtr prefs, SchemaPtr schema): prefs(prefs), schema(schema) {
            onChanged = [this](std::string value) {
                this->changed = true;
            };
        }